

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O1

size_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::findImpl<axl::sl::BoyerMooreTextAccessor>
          (BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
           *this,BoyerMooreTextAccessor *accessor,size_t i0,size_t length)

{
  ulong uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  size_t sVar4;
  BoyerMooreTextState *pBVar5;
  size_t sVar6;
  wchar_t *pwVar7;
  size_t tailLength;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  wchar_t *pwVar12;
  size_t local_60;
  
  sVar4 = (this->m_pattern).super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count;
  uVar8 = (sVar4 - 1) + i0;
  pBVar5 = (accessor->
           super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>).
           m_state;
  do {
    if (length <= uVar8) {
      return uVar8 - (sVar4 - 1);
    }
    uVar10 = (pBVar5->super_BoyerMooreStateBase<wchar_t>).m_tail.m_length;
    sVar9 = (uVar8 - sVar4) + 1;
    pwVar12 = (accessor->
              super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>)
              .m_p + (uVar8 - uVar10);
    lVar11 = 0;
    while( true ) {
      uVar1 = lVar11 + uVar8;
      pwVar7 = pwVar12;
      if (uVar1 < uVar10) {
        pwVar7 = (pBVar5->super_BoyerMooreStateBase<wchar_t>).m_tail.m_buffer.
                 super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_p +
                 ((pBVar5->super_BoyerMooreStateBase<wchar_t>).m_tail.m_front + uVar1) %
                 (pBVar5->super_BoyerMooreStateBase<wchar_t>).m_tail.m_buffer.
                 super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count;
      }
      wVar2 = *pwVar7;
      wVar3 = (this->m_pattern).super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_p
              [sVar4 + lVar11 + -1];
      if (wVar2 != wVar3) break;
      sVar6 = sVar9;
      if (1 - sVar4 == lVar11) goto LAB_001235d7;
      lVar11 = lVar11 + -1;
      pwVar12 = pwVar12 + -1;
    }
    uVar8 = (this->m_skipTables).m_badSkipTable.super_BoyerMooreSkipTableRoot.m_table.
            super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p
            [(ulong)(long)wVar2 %
             (this->m_skipTables).m_badSkipTable.super_BoyerMooreSkipTableRoot.m_table.
             super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_count];
    uVar10 = (this->m_skipTables).m_goodSkipTable.super_BoyerMooreSkipTableRoot.m_table.
             super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p
             [sVar4 + lVar11 + -1];
    if (uVar10 < uVar8) {
      uVar10 = uVar8;
    }
    sVar9 = uVar10 + uVar1;
    sVar6 = local_60;
LAB_001235d7:
    local_60 = sVar6;
    uVar8 = sVar9;
    if (wVar2 == wVar3) {
      return local_60;
    }
  } while( true );
}

Assistant:

size_t
	findImpl(
		const Accessor& accessor,
		size_t i0,
		size_t length
	) const {
		size_t last = m_pattern.getCount() - 1;
		size_t i = i0 + last;
		while (i < length) {
			intptr_t j = last;
			C c;
			for (;;) {
				c = accessor[i];
				if (c != m_pattern[j])
					break;

				if (j == 0)
					return i;

				i--;
				j--;
			}

			i += m_skipTables.getSkip(c, j);
		}

		return i - last; // prospective start of match
	}